

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

Cluster * __thiscall mkvparser::Segment::GetLast(Segment *this)

{
  Cluster *pCluster;
  long idx;
  Segment *this_local;
  Cluster *local_8;
  
  if ((this->m_clusters == (Cluster **)0x0) || (this->m_clusterCount < 1)) {
    local_8 = &this->m_eos;
  }
  else {
    local_8 = this->m_clusters[this->m_clusterCount + -1];
  }
  return local_8;
}

Assistant:

const Cluster* Segment::GetLast() const {
  if ((m_clusters == NULL) || (m_clusterCount <= 0))
    return &m_eos;

  const long idx = m_clusterCount - 1;

  Cluster* const pCluster = m_clusters[idx];
  assert(pCluster);

  return pCluster;
}